

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alcCaptureCloseDevice(void)

{
  ALCboolean retval_00;
  ALCdevice *device_00;
  ALCboolean retval;
  ALCdevice *device;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&device);
  if (io_failure == 0) {
    device_00 = (ALCdevice *)IO_PTR();
    retval_00 = IO_ALCBOOLEAN();
    if (io_failure == 0) {
      visit_alcCaptureCloseDevice((CallerInfo *)&device,retval_00,device_00);
    }
    add_devicelabel_to_map(device_00,(char *)0x0);
  }
  return;
}

Assistant:

static void decode_alcCaptureCloseDevice(void)
{
    IO_START(alcCaptureCloseDevice);
    ALCdevice *device = (ALCdevice *) IO_PTR();
    const ALCboolean retval = IO_ALCBOOLEAN();
    if (!io_failure) visit_alcCaptureCloseDevice(&callerinfo, retval, device);
    add_devicelabel_to_map(device, NULL);
    IO_END();
}